

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

void __thiscall fizplex::Base::Base(Base *this,ColMatrix *b)

{
  unsigned_long *puVar1;
  size_t sVar2;
  size_t sVar3;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *__x;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  ETM local_50;
  
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = ColMatrix::row_count(b);
  DVector::DVector(&this->work,sVar2);
  sVar2 = ColMatrix::row_count(b);
  this->m = sVar2;
  std::make_unique<unsigned_long[]>((size_t)&this->row_ordering);
  sVar2 = ColMatrix::row_count(b);
  sVar3 = ColMatrix::col_count(b);
  if (sVar2 == sVar3) {
    for (uVar5 = 0; uVar4 = this->m, uVar5 < uVar4; uVar5 = uVar5 + 1) {
      __x = &ColMatrix::column(b,uVar5)->values;
      std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
                ((vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)
                 &local_50,__x);
      local_50.col = uVar5;
      std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::
      emplace_back<fizplex::Base::ETM>(&this->etms,&local_50);
      std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
      ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                     *)&local_50);
    }
    puVar1 = (this->row_ordering)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      puVar1[uVar5] = uVar5;
      uVar4 = this->m;
    }
    invert(this);
    return;
  }
  __assert_fail("b.row_count() == b.col_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,8,"fizplex::Base::Base(const ColMatrix &)");
}

Assistant:

Base::Base(const ColMatrix &b)
    : work(b.row_count()), m(b.row_count()),
      row_ordering(std::make_unique<size_t[]>(m)) {
  assert(b.row_count() == b.col_count());
  for (size_t i = 0; i < m; i++)
    etms.push_back(ETM(b.column(i), i));
  for (size_t i = 0; i < m; i++)
    row_ordering[i] = i;
  invert();
}